

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_promise_resolve_function_call
                  (JSContext *ctx,JSValue func_obj,JSValue this_val,int argc,JSValue *argv,int flags
                  )

{
  JSValue *pJVar1;
  ushort uVar2;
  int iVar3;
  JSValueUnion *pJVar4;
  int *piVar5;
  BOOL BVar6;
  JSValueUnion JVar7;
  int iVar8;
  JSRuntime *pJVar9;
  JSRefCountHeader *p;
  int64_t iVar10;
  JSValueUnion JVar11;
  char cVar12;
  JSValue JVar13;
  JSValue JVar14;
  JSValue value;
  JSValue this_obj;
  JSValueUnion local_68;
  JSValueUnion JStack_60;
  JSValueUnion local_58;
  int64_t local_50;
  JSValue local_48;
  
  pJVar4 = *(JSValueUnion **)((long)func_obj.u.ptr + 0x30);
  if ((pJVar4 == (JSValueUnion *)0x0) || (*(int *)((long)pJVar4[2].ptr + 4) != 0))
  goto LAB_0012ed75;
  *(undefined4 *)((long)pJVar4[2].ptr + 4) = 1;
  iVar8 = *(ushort *)((long)func_obj.u.ptr + 6) - 0x2b;
  if (argc < 1) {
    iVar10 = 3;
    JVar11.float64 = 0.0;
  }
  else {
    JVar11 = (JSValueUnion)(argv->u).ptr;
    iVar10 = argv->tag;
  }
  if ((int)iVar10 != -1 || iVar8 != 0) {
LAB_0012ed5c:
    value.tag = iVar10;
    value.u.ptr = JVar11.ptr;
    fulfill_or_reject_promise(ctx,*(JSValue *)pJVar4,value,iVar8);
    goto LAB_0012ed75;
  }
  JVar14.tag = iVar10;
  JVar14.u.ptr = JVar11.ptr;
  BVar6 = js_same_value(ctx,JVar14,*(JSValue *)pJVar4);
  if (BVar6 == 0) {
    JVar13.tag = iVar10;
    JVar13.u.ptr = JVar11.ptr;
    this_obj.tag = iVar10;
    this_obj.u.ptr = JVar11.ptr;
    JVar14 = JS_GetPropertyInternal(ctx,JVar13,0x7f,this_obj,0);
    JVar7 = JVar14.u;
    if ((JVar14.tag & 0xffffffffU) == 6) goto LAB_0012ec3e;
    if ((uint)JVar14.tag != 0xffffffff) {
LAB_0012ed3e:
      if ((0xfffffff4 < (uint)JVar14.tag) &&
         (iVar3 = *JVar7.ptr, *(int *)JVar7.ptr = iVar3 + -1, iVar3 < 2)) {
        __JS_FreeValueRT(ctx->rt,JVar14);
      }
      goto LAB_0012ed5c;
    }
    uVar2 = *(ushort *)((long)JVar7.ptr + 6);
    if (uVar2 != 0xd) {
      if (uVar2 == 0x29) {
        cVar12 = *(char *)(*(long *)((long)JVar7.ptr + 0x30) + 0x20);
      }
      else {
        cVar12 = ctx->rt->class_array[uVar2].call != (JSClassCall *)0x0;
      }
      if (cVar12 == '\0') goto LAB_0012ed3e;
    }
    local_68 = *pJVar4;
    JStack_60 = pJVar4[1];
    local_58 = JVar11;
    local_50 = iVar10;
    local_48 = JVar14;
    JS_EnqueueJob(ctx,js_promise_resolve_thenable_job,3,(JSValue *)&local_68);
    iVar8 = *JVar7.ptr;
    *(int *)JVar7.ptr = iVar8 + -1;
    if (1 < iVar8) goto LAB_0012ed75;
    pJVar9 = ctx->rt;
  }
  else {
    JS_ThrowTypeError(ctx,"promise self resolution");
LAB_0012ec3e:
    pJVar9 = ctx->rt;
    pJVar1 = &pJVar9->current_exception;
    piVar5 = (int *)(pJVar1->u).ptr;
    iVar10 = (pJVar9->current_exception).tag;
    JVar14 = *pJVar1;
    JVar13 = *pJVar1;
    (pJVar9->current_exception).u.int32 = 0;
    (pJVar9->current_exception).tag = 2;
    fulfill_or_reject_promise(ctx,*(JSValue *)pJVar4,JVar13,1);
    if (((uint)iVar10 < 0xfffffff5) || (iVar8 = *piVar5, *piVar5 = iVar8 + -1, 1 < iVar8))
    goto LAB_0012ed75;
    pJVar9 = ctx->rt;
  }
  __JS_FreeValueRT(pJVar9,JVar14);
LAB_0012ed75:
  return (JSValue)(ZEXT816(3) << 0x40);
}

Assistant:

static JSValue js_promise_resolve_function_call(JSContext *ctx,
                                                JSValueConst func_obj,
                                                JSValueConst this_val,
                                                int argc, JSValueConst *argv,
                                                int flags)
{
    JSObject *p = JS_VALUE_GET_OBJ(func_obj);
    JSPromiseFunctionData *s;
    JSValueConst resolution, args[3];
    JSValue then;
    BOOL is_reject;

    s = p->u.promise_function_data;
    if (!s || s->presolved->already_resolved)
        return JS_UNDEFINED;
    s->presolved->already_resolved = TRUE;
    is_reject = p->class_id - JS_CLASS_PROMISE_RESOLVE_FUNCTION;
    if (argc > 0)
        resolution = argv[0];
    else
        resolution = JS_UNDEFINED;
#ifdef DUMP_PROMISE
    printf("js_promise_resolving_function_call: is_reject=%d resolution=", is_reject);
    JS_DumpValue(ctx, resolution);
    printf("\n");
#endif
    if (is_reject || !JS_IsObject(resolution)) {
        goto done;
    } else if (js_same_value(ctx, resolution, s->promise)) {
        JS_ThrowTypeError(ctx, "promise self resolution");
        goto fail_reject;
    }
    then = JS_GetProperty(ctx, resolution, JS_ATOM_then);
    if (JS_IsException(then)) {
        JSValue error;
    fail_reject:
        error = JS_GetException(ctx);
        reject_promise(ctx, s->promise, error);
        JS_FreeValue(ctx, error);
    } else if (!JS_IsFunction(ctx, then)) {
        JS_FreeValue(ctx, then);
    done:
        fulfill_or_reject_promise(ctx, s->promise, resolution, is_reject);
    } else {
        args[0] = s->promise;
        args[1] = resolution;
        args[2] = then;
        JS_EnqueueJob(ctx, js_promise_resolve_thenable_job, 3, args);
        JS_FreeValue(ctx, then);
    }
    return JS_UNDEFINED;
}